

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (TestResult *result,string *indent)

{
  int iVar1;
  int iVar2;
  string *in_RDI;
  TestProperty *property;
  int i;
  Message attributes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  Message *in_stack_ffffffffffffff00;
  allocator *in_stack_ffffffffffffff08;
  TestResult *in_stack_ffffffffffffff10;
  Message *in_stack_ffffffffffffff30;
  allocator local_89;
  string local_88 [32];
  string local_68 [32];
  char *local_48;
  TestProperty *local_30;
  int local_24;
  
  Message::Message(in_stack_ffffffffffffff30);
  local_24 = 0;
  while( true ) {
    iVar1 = local_24;
    iVar2 = TestResult::test_property_count((TestResult *)0x1368fc);
    if (iVar2 <= iVar1) break;
    local_30 = TestResult::GetTestProperty
                         (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20))
    ;
    Message::operator<<(in_stack_ffffffffffffff00,(char (*) [3])in_stack_fffffffffffffef8);
    Message::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Message::operator<<(in_stack_ffffffffffffff00,(char (*) [2])in_stack_fffffffffffffef8);
    local_48 = TestProperty::key((TestProperty *)0x13698b);
    Message::operator<<(in_stack_ffffffffffffff00,(char **)in_stack_fffffffffffffef8);
    Message::operator<<(in_stack_ffffffffffffff00,(char (*) [4])in_stack_fffffffffffffef8);
    Message::operator<<(in_stack_ffffffffffffff00,(char (*) [2])in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff10 = (TestResult *)TestProperty::value((TestProperty *)0x1369f5);
    in_stack_ffffffffffffff08 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,(char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    EscapeJson(in_RDI);
    in_stack_ffffffffffffff00 =
         Message::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Message::operator<<(in_stack_ffffffffffffff00,(char (*) [2])in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    local_24 = local_24 + 1;
  }
  Message::GetString_abi_cxx11_((Message *)in_stack_ffffffffffffff08);
  Message::~Message((Message *)0x136b41);
  return in_RDI;
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n"
               << indent << "\"" << property.key() << "\": " << "\""
               << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}